

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

void boost::this_thread::hidden::sleep_until_realtime(timespec *ts)

{
  bool bVar1;
  thread_data_base *ptVar2;
  timespec *unaff_retaddr;
  unique_lock<boost::mutex> lk;
  thread_data_base *thread_info;
  timespec *in_stack_00000058;
  unique_lock<boost::mutex> *in_stack_00000060;
  condition_variable *in_stack_00000068;
  mutex *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  ptVar2 = detail::get_current_thread_data();
  if (ptVar2 == (thread_data_base *)0x0) {
    no_interruption_point::hidden::sleep_until_realtime(unaff_retaddr);
  }
  else {
    unique_lock<boost::mutex>::unique_lock
              ((unique_lock<boost::mutex> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    do {
      bVar1 = condition_variable::do_wait_until
                        (in_stack_00000068,in_stack_00000060,in_stack_00000058);
      in_stack_ffffffffffffffd0 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffd0);
    } while (bVar1);
    unique_lock<boost::mutex>::~unique_lock
              ((unique_lock<boost::mutex> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  return;
}

Assistant:

void BOOST_THREAD_DECL sleep_until_realtime(const timespec& ts)
        {
            boost::detail::thread_data_base* const thread_info=boost::detail::get_current_thread_data();

            if(thread_info)
            {
              unique_lock<mutex> lk(thread_info->sleep_mutex);
              while(thread_info->sleep_condition.do_wait_until(lk,ts)) {}
            }
            else
            {
              boost::this_thread::no_interruption_point::hidden::sleep_until_realtime(ts);
            }
        }